

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_write(Curl_easy *data,char *str,size_t nread,_Bool is_eos)

{
  int *piVar1;
  char cVar2;
  connectdata *pcVar3;
  long lVar4;
  size_t sVar5;
  CURLcode CVar6;
  long lVar7;
  size_t sVar8;
  bool bVar9;
  size_t sVar10;
  size_t sVar11;
  
  pcVar3 = data->conn;
  bVar9 = false;
  sVar10 = 0;
  sVar11 = 0;
  do {
    lVar4 = *(long *)&(pcVar3->proto).imapc.sasl.state;
    if (sVar11 == nread) {
      CVar6 = CURLE_OK;
      if (lVar4 == 0) {
        if (nread - sVar10 != 0) {
          CVar6 = Curl_client_write(data,1,str + sVar10,nread - sVar10);
          return CVar6;
        }
      }
      else if (lVar4 == 5) {
        CVar6 = Curl_client_write(data,1,"\r\n.\r\n",2);
        piVar1 = &(data->req).keepon;
        *(byte *)piVar1 = (byte)*piVar1 & 0xfe;
        (pcVar3->proto).ftpc.alternative_to_user = (char *)0x0;
      }
      return CVar6;
    }
    cVar2 = str[sVar11];
    if (cVar2 == '\n') {
      if ((lVar4 == 4) || (lVar4 == 1)) {
        sVar8 = lVar4 + 1;
        goto LAB_00145d3b;
      }
LAB_00145d44:
      sVar8 = 0;
LAB_00145d46:
      (pcVar3->proto).pop3c.eob = sVar8;
      if (lVar4 != 0) {
LAB_00145d52:
        for (lVar7 = 0; sVar8 = lVar4 - lVar7, sVar8 != 0; lVar7 = lVar7 + 1) {
          sVar5 = (pcVar3->proto).pop3c.strip;
          if (sVar5 == 0) {
            if (((!bVar9) || (sVar8 = (lVar4 + -1) - lVar7, sVar8 != 0)) &&
               (CVar6 = Curl_client_write(data,1,"\r\n.\r\n",sVar8), CVar6 != CURLE_OK)) {
              return CVar6;
            }
            bVar9 = false;
            sVar10 = sVar11;
            break;
          }
          (pcVar3->proto).ftpc.entrypath = (char *)(sVar5 - 1);
        }
      }
    }
    else if (cVar2 == '.') {
      sVar8 = 3;
      if (lVar4 != 2) {
        if (lVar4 != 3) goto LAB_00145d44;
        (pcVar3->proto).ftpc.alternative_to_user = (char *)0x0;
        bVar9 = true;
        goto LAB_00145d52;
      }
LAB_00145d3b:
      (pcVar3->proto).pop3c.eob = sVar8;
    }
    else {
      if (cVar2 != '\r') goto LAB_00145d44;
      sVar8 = 4;
      if (lVar4 == 3) goto LAB_00145d3b;
      sVar8 = 1;
      if (lVar4 != 0) goto LAB_00145d46;
      (pcVar3->proto).pop3c.eob = 1;
      if ((sVar11 != 0) &&
         (CVar6 = Curl_client_write(data,1,str + sVar10,sVar11 - sVar10), sVar10 = sVar11,
         CVar6 != CURLE_OK)) {
        return CVar6;
      }
    }
    sVar11 = sVar11 + 1;
  } while( true );
}

Assistant:

static CURLcode pop3_write(struct Curl_easy *data, const char *str,
                           size_t nread, bool is_eos)
{
  /* This code could be made into a special function in the handler struct */
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  struct connectdata *conn = data->conn;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  bool strip_dot = FALSE;
  size_t last = 0;
  size_t i;
  (void)is_eos;

  /* Search through the buffer looking for the end-of-body marker which is
     5 bytes (0d 0a 2e 0d 0a). Note that a line starting with a dot matches
     the eob so the server will have prefixed it with an extra dot which we
     need to strip out. Additionally the marker could of course be spread out
     over 5 different data chunks. */
  for(i = 0; i < nread; i++) {
    size_t prev = pop3c->eob;

    switch(str[i]) {
    case 0x0d:
      if(pop3c->eob == 0) {
        pop3c->eob++;

        if(i) {
          /* Write out the body part that did not match */
          result = Curl_client_write(data, CLIENTWRITE_BODY, &str[last],
                                     i - last);

          if(result)
            return result;

          last = i;
        }
      }
      else if(pop3c->eob == 3)
        pop3c->eob++;
      else
        /* If the character match was not at position 0 or 3 then restart the
           pattern matching */
        pop3c->eob = 1;
      break;

    case 0x0a:
      if(pop3c->eob == 1 || pop3c->eob == 4)
        pop3c->eob++;
      else
        /* If the character match was not at position 1 or 4 then start the
           search again */
        pop3c->eob = 0;
      break;

    case 0x2e:
      if(pop3c->eob == 2)
        pop3c->eob++;
      else if(pop3c->eob == 3) {
        /* We have an extra dot after the CRLF which we need to strip off */
        strip_dot = TRUE;
        pop3c->eob = 0;
      }
      else
        /* If the character match was not at position 2 then start the search
           again */
        pop3c->eob = 0;
      break;

    default:
      pop3c->eob = 0;
      break;
    }

    /* Did we have a partial match which has subsequently failed? */
    if(prev && prev >= pop3c->eob) {
      /* Strip can only be non-zero for the very first mismatch after CRLF
         and then both prev and strip are equal and nothing will be output
         below */
      while(prev && pop3c->strip) {
        prev--;
        pop3c->strip--;
      }

      if(prev) {
        /* If the partial match was the CRLF and dot then only write the CRLF
           as the server would have inserted the dot */
        if(strip_dot && prev - 1 > 0) {
          result = Curl_client_write(data, CLIENTWRITE_BODY, (char *)POP3_EOB,
                                     prev - 1);
        }
        else if(!strip_dot) {
          result = Curl_client_write(data, CLIENTWRITE_BODY, (char *)POP3_EOB,
                                     prev);
        }
        else {
          result = CURLE_OK;
        }

        if(result)
          return result;

        last = i;
        strip_dot = FALSE;
      }
    }
  }

  if(pop3c->eob == POP3_EOB_LEN) {
    /* We have a full match so the transfer is done, however we must transfer
    the CRLF at the start of the EOB as this is considered to be part of the
    message as per RFC-1939, sect. 3 */
    result = Curl_client_write(data, CLIENTWRITE_BODY, (char *)POP3_EOB, 2);

    k->keepon &= ~KEEP_RECV;
    pop3c->eob = 0;

    return result;
  }

  if(pop3c->eob)
    /* While EOB is matching nothing should be output */
    return CURLE_OK;

  if(nread - last) {
    result = Curl_client_write(data, CLIENTWRITE_BODY, &str[last],
                               nread - last);
  }

  return result;
}